

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O1

void udp_recv(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  int iVar1;
  int namelen;
  sockaddr sockname;
  sockaddr local_28;
  
  if (-1 < nread) {
    free(buf->base);
    if (nread != 0) {
      local_28.sa_family = 0xffff;
      local_28.sa_data[0] = -1;
      local_28.sa_data[1] = -1;
      local_28.sa_data[2] = -1;
      local_28.sa_data[3] = -1;
      local_28.sa_data[4] = -1;
      local_28.sa_data[5] = -1;
      local_28.sa_data[6] = -1;
      local_28.sa_data[7] = -1;
      local_28.sa_data[8] = -1;
      local_28.sa_data[9] = -1;
      local_28.sa_data[10] = -1;
      local_28.sa_data[0xb] = -1;
      local_28.sa_data[0xc] = -1;
      local_28.sa_data[0xd] = -1;
      iVar1 = uv_udp_getsockname(&udp);
      if (iVar1 != 0) goto LAB_0015c5a7;
      check_sockname(&local_28,"0.0.0.0",0,"udp receiving socket");
      getsocknamecount = getsocknamecount + 1;
      uv_close(&udp,0);
      uv_close(handle,0);
    }
    return;
  }
  udp_recv_cold_1();
LAB_0015c5a7:
  udp_recv_cold_2();
  return;
}

Assistant:

static void udp_recv(uv_udp_t* handle,
                     ssize_t nread,
                     const uv_buf_t* buf,
                     const struct sockaddr* addr,
                     unsigned flags) {
  struct sockaddr sockname;
  int namelen;
  int r;

  ASSERT(nread >= 0);
  free(buf->base);

  if (nread == 0) {
    return;
  }

  memset(&sockname, -1, sizeof sockname);
  namelen = sizeof(sockname);
  r = uv_udp_getsockname(&udp, &sockname, &namelen);
  ASSERT(r == 0);
  check_sockname(&sockname, "0.0.0.0", 0, "udp receiving socket");
  getsocknamecount++;

  uv_close((uv_handle_t*) &udp, NULL);
  uv_close((uv_handle_t*) handle, NULL);
}